

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_bool(char *p,bool *value)

{
  bool bVar1;
  int iVar2;
  uint local_2c;
  bool *pbStack_28;
  uint v;
  char *q;
  bool *value_local;
  char *p_local;
  
  *value = false;
  q = value;
  value_local = (bool *)p;
  iVar2 = strcasecmp(p,"false");
  if (iVar2 == 0) {
    p_local._7_1_ = true;
  }
  else {
    iVar2 = strcasecmp(value_local,"true");
    if (iVar2 == 0) {
      *q = '\x01';
      p_local._7_1_ = true;
    }
    else {
      pbStack_28 = value_local;
      bVar1 = string_to_uint(&stack0xffffffffffffffd8,&local_2c);
      if (bVar1) {
        if (local_2c == 0) {
          return true;
        }
        if (local_2c == 1) {
          *q = '\x01';
          return true;
        }
      }
      p_local._7_1_ = false;
    }
  }
  return p_local._7_1_;
}

Assistant:

bool string_to_bool(const char* p, bool& value)
    {
        CRNLIB_ASSERT(p);

        value = false;

        if (_stricmp(p, "false") == 0)
        {
            return true;
        }

        if (_stricmp(p, "true") == 0)
        {
            value = true;
            return true;
        }

        const char* q = p;
        uint v;
        if (string_to_uint(q, v))
        {
            if (!v)
            {
                return true;
            }
            else if (v == 1)
            {
                value = true;
                return true;
            }
        }

        return false;
    }